

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

string * __thiscall
kratos::Var::handle_name_abi_cxx11_(string *__return_storage_ptr__,Var *this,bool ignore_top)

{
  int iVar1;
  undefined4 extraout_var;
  ulong uVar2;
  undefined4 extraout_var_00;
  remove_reference_t<std::__cxx11::basic_string<char>_> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  remove_reference_t<std::__cxx11::basic_string<char>_> local_120;
  string local_f0;
  undefined1 local_d0 [8];
  string gen_name;
  bool ignore_top_local;
  Var *this_local;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_98;
  basic_string_view<char> local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  string *local_48;
  char *local_40;
  string *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  gen_name.field_2._M_local_buf[0xf] = ignore_top;
  iVar1 = (*(this->super_IRNode)._vptr_IRNode[0xd])();
  Generator::handle_name_abi_cxx11_
            ((string *)local_d0,(Generator *)CONCAT44(extraout_var,iVar1),
             (bool)(gen_name.field_2._M_local_buf[0xf] & 1));
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    iVar1 = (*(this->super_IRNode)._vptr_IRNode[0xd])();
    Generator::handle_name_abi_cxx11_
              (&local_f0,(Generator *)CONCAT44(extraout_var_00,iVar1),
               (bool)(gen_name.field_2._M_local_buf[0xf] & 1));
    (*(this->super_IRNode)._vptr_IRNode[0x1f])(&local_120);
    local_40 = "{0}.{1}";
    local_48 = &local_f0;
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_120;
    local_38 = __return_storage_ptr__;
    fmt::v7::make_args_checked<std::__cxx11::string,std::__cxx11::string,char[8],char>
              (&local_78,(v7 *)0x431621,(char (*) [8])local_48,
               (remove_reference_t<std::__cxx11::basic_string<char>_> *)vargs,in_R8);
    local_58 = &local_78;
    local_88 = fmt::v7::to_string_view<char,_0>(local_40);
    local_28 = &local_98;
    local_30 = local_58;
    local_20 = local_58;
    local_10 = local_58;
    local_18 = local_28;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,0xdd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_58);
    format_str.size_ = local_98.desc_;
    format_str.data_ = (char *)local_88.size_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_98.field_1.values_;
    fmt::v7::detail::vformat_abi_cxx11_
              (__return_storage_ptr__,(detail *)local_88.data_,format_str,args);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  else {
    (*(this->super_IRNode)._vptr_IRNode[0x1f])(__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)local_d0);
  return __return_storage_ptr__;
}

Assistant:

std::string Var::handle_name(bool ignore_top) const {
    auto gen_name = generator()->handle_name(ignore_top);
    if (!gen_name.empty())
        return ::format("{0}.{1}", generator()->handle_name(ignore_top), to_string());
    else
        return to_string();
}